

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O3

PmError alsa_poll(PmInternal *midi)

{
  long lVar1;
  int iVar2;
  descriptor_type paVar3;
  long lVar4;
  long lVar5;
  snd_seq_event_t *ev;
  snd_seq_event_t *local_30;
  
  iVar2 = snd_seq_event_input_pending(seq,1);
  while (0 < iVar2) {
    while (iVar2 = snd_seq_event_input_pending(seq,0), 0 < iVar2) {
      iVar2 = snd_seq_event_input(seq);
      if (iVar2 < 0) {
        if (0 < pm_descriptor_index && iVar2 == -0x1c) {
          lVar4 = 0x30;
          lVar5 = 0;
          paVar3 = descriptors;
          iVar2 = pm_descriptor_index;
          do {
            if ((*(int *)((long)paVar3 + lVar4 + -0x18) != 0) &&
               (lVar1 = *(long *)((long)&(paVar3->pub).structVersion + lVar4), lVar1 != 0)) {
              Pm_SetOverflow(*(PmQueue **)(lVar1 + 0x20));
              paVar3 = descriptors;
              iVar2 = pm_descriptor_index;
            }
            lVar5 = lVar5 + 1;
            lVar4 = lVar4 + 0x40;
          } while (lVar5 < iVar2);
        }
      }
      else {
        handle_event(local_30);
      }
    }
    iVar2 = snd_seq_event_input_pending(seq,1);
  }
  return pmNoData;
}

Assistant:

static PmError alsa_poll(PmInternal *midi)
{
    snd_seq_event_t *ev;
    /* expensive check for input data, gets data from device: */
    while (snd_seq_event_input_pending(seq, TRUE) > 0) {
        /* cheap check on local input buffer */
        while (snd_seq_event_input_pending(seq, FALSE) > 0) {
            /* check for and ignore errors, e.g. input overflow */
            /* note: if there's overflow, this should be reported
             * all the way through to client. Since input from all
             * devices is merged, we need to find all input devices
             * and set all to the overflow state.
             * NOTE: this assumes every input is ALSA based.
             */
            int rslt = snd_seq_event_input(seq, &ev);
            if (rslt >= 0) {
                handle_event(ev);
            } else if (rslt == -ENOSPC) {
                int i;
                for (i = 0; i < pm_descriptor_index; i++) {
                    if (descriptors[i].pub.input) {
                        PmInternal *midi = (PmInternal *) 
                                descriptors[i].internalDescriptor;
                        /* careful, device may not be open! */
                        if (midi) Pm_SetOverflow(midi->queue);
                    }
                }
            }
        }
    }
    return pmNoError;
}